

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.h
# Opt level: O3

JavascriptString * __thiscall Js::CompoundString::Builder<256U>::ToString(Builder<256U> *this)

{
  CharCount stringLength;
  JavascriptLibrary *pJVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  char16 *pcVar5;
  JavascriptString *pJVar6;
  CompoundString *pCVar7;
  
  this->isFinalized = true;
  if (this->compoundString != (CompoundString *)0x0) {
    return (JavascriptString *)this->compoundString;
  }
  stringLength = this->stringLength;
  if (stringLength == 0) {
    pJVar6 = JavascriptLibrary::GetEmptyString
                       ((this->scriptContext->super_ScriptContextBase).javascriptLibrary);
    return pJVar6;
  }
  if (stringLength != 1) {
    pCVar7 = CompoundString::New(stringLength,this->directCharLength,this,this->charLength,false,
                                 (this->scriptContext->super_ScriptContextBase).javascriptLibrary);
    return (JavascriptString *)pCVar7;
  }
  if (this->directCharLength != 0xffffffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x343,"(HasOnlyDirectChars())","HasOnlyDirectChars()");
    if (!bVar3) goto LAB_00d1cc23;
    *puVar4 = 0;
  }
  if (this->charLength != 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x344,"(LastBlockCharLength() == 1)","LastBlockCharLength() == 1");
    if (!bVar3) {
LAB_00d1cc23:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pJVar1 = (this->scriptContext->super_ScriptContextBase).javascriptLibrary;
  pcVar5 = Block::Chars(this);
  pJVar6 = CharStringCache::GetStringForChar(&pJVar1->charStringCache,*pcVar5);
  return pJVar6;
}

Assistant:

inline JavascriptString *CompoundString::Builder<MinimumCharCapacity>::ToString()
    {
    #if DBG
        // Should not append to the builder after this function is called
        isFinalized = true;
    #endif

        CompoundString *const compoundString = this->compoundString;
        if(compoundString)
            return compoundString;

        switch(stringLength)
        {
            default:
                return CreateCompoundString(false);

            case 0:
                return this->GetLibrary()->GetEmptyString();

            case 1:
                Assert(HasOnlyDirectChars());
                Assert(LastBlockCharLength() == 1);

                return this->GetLibrary()->GetCharStringCache().GetStringForChar(LastBlockChars()[0]);
        }
    }